

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BibIndexer.h
# Opt level: O0

void __thiscall
BibEntryIssue::BibEntryIssue(BibEntryIssue *this,TSRange range,Severity sev,int code,string *msg)

{
  TSRange TVar1;
  allocator<char> local_21;
  string *local_20;
  string *msg_local;
  int code_local;
  Severity sev_local;
  BibEntryIssue *this_local;
  
  TVar1 = range;
  local_20 = msg;
  msg_local._0_4_ = code;
  msg_local._4_4_ = sev;
  _code_local = this;
  Init::Reflectable::Reflectable(&this->super_Reflectable);
  (this->super_Reflectable)._vptr_Reflectable = (_func_int **)&PTR_reflect_002cdc70;
  (this->range).start_byte = range.start_byte;
  (this->range).end_byte = range.end_byte;
  range.start_point = TVar1.start_point;
  range.end_point = TVar1.end_point;
  (this->range).start_point = range.start_point;
  (this->range).end_point = range.end_point;
  this->severity = msg_local._4_4_;
  this->code = (int)msg_local;
  std::__cxx11::string::string((string *)&this->message,(string *)msg);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&this->source,"biber",&local_21);
  std::allocator<char>::~allocator(&local_21);
  return;
}

Assistant:

BibEntryIssue (TSRange range, Severity sev, int code, string msg) : range { range }, severity { sev }, code { code }, message { msg } {}